

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O1

float calc_download_speed(http_t *info)

{
  int iVar1;
  
  iVar1 = (int)info->end_recv_time - (int)info->start_recv_time;
  return (float)info->recv_data_len / (float)(int)(iVar1 + (uint)(iVar1 == 0));
}

Assistant:

float calc_download_speed(http_t *info) {
  int diff_time = 0;
  float speed = 0.0;

  diff_time = info->end_recv_time - info->start_recv_time;
  /* 最小间隔1s，避免计算浮点数结果为inf */
  if (0 == diff_time) diff_time = 1;
  speed = (float)info->recv_data_len / diff_time;

  return speed;
}